

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_library.cpp
# Opt level: O0

void __thiscall Omega_h::Library::initialize(Library *this,char *head_desc,int *argc,char ***argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  Comm *pCVar6;
  CmdLineFlag *pCVar7;
  History *pHVar8;
  double dVar9;
  allocator local_8c9;
  string local_8c8 [39];
  allocator local_8a1;
  string local_8a0 [39];
  allocator local_879;
  string local_878 [39];
  allocator local_851;
  string local_850 [39];
  allocator local_829;
  string local_828 [39];
  allocator local_801;
  string local_800 [39];
  allocator local_7d9;
  string local_7d8 [39];
  undefined1 local_7b1;
  shared_ptr<Omega_h::Comm> local_7b0;
  allocator local_799;
  string local_798 [39];
  undefined1 local_771;
  shared_ptr<Omega_h::Comm> local_770;
  allocator local_759;
  string local_758 [39];
  allocator local_731;
  string local_730 [39];
  allocator local_709;
  string local_708 [32];
  double local_6e8;
  double chop;
  string local_6d8 [39];
  byte local_6b1;
  undefined1 local_6b0 [7];
  bool add_filename;
  int local_6a0;
  allocator local_699;
  string local_698 [39];
  allocator local_671;
  string local_670 [39];
  allocator local_649;
  string local_648 [32];
  CmdLineFlag *local_628;
  CmdLineFlag *mpi_ranks_flag;
  string local_618 [39];
  allocator local_5f1;
  string local_5f0 [39];
  allocator local_5c9;
  string local_5c8 [32];
  CmdLineFlag *local_5a8;
  CmdLineFlag *self_send_flag;
  string local_598 [39];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [32];
  double local_410;
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [32];
  CmdLineFlag *local_390;
  CmdLineFlag *osh_time_chop_flag;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  undefined1 local_298 [8];
  CmdLine cmdline;
  shared_ptr<Omega_h::Comm> local_248;
  allocator local_231;
  string local_230 [36];
  int local_20c;
  int ic;
  string msg_str;
  stringstream local_1e8 [8];
  stringstream msg;
  ostream local_1d8 [399];
  allocator local_49;
  string local_48 [8];
  string lib_desc;
  char ***argv_local;
  int *argc_local;
  char *head_desc_local;
  Library *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"9.34.13-sha.dc235450+00000010000000001",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,head_desc);
  if (bVar2) {
    std::__cxx11::stringstream::stringstream(local_1e8);
    std::operator<<(local_1d8,"omega_h description string mismatch.\n");
    poVar4 = std::operator<<(local_1d8,"header says: ");
    poVar4 = std::operator<<(poVar4,head_desc);
    std::operator<<(poVar4,'\n');
    poVar4 = std::operator<<(local_1d8,"library says: ");
    poVar4 = std::operator<<(poVar4,local_48);
    std::operator<<(poVar4,'\n');
    std::__cxx11::stringstream::str();
    uVar5 = std::__cxx11::string::c_str();
    fail("%s\n",uVar5);
  }
  if ((argc != (int *)0x0) && (argv != (char ***)0x0)) {
    for (local_20c = 0; local_20c < *argc; local_20c = local_20c + 1) {
      pcVar1 = (*argv)[local_20c];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,pcVar1,&local_231);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->argv_,(value_type *)local_230);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
    }
  }
  pCVar6 = (Comm *)operator_new(0x50);
  Comm::Comm(pCVar6,this,false,false);
  std::shared_ptr<Omega_h::Comm>::shared_ptr<Omega_h::Comm,void>(&local_248,pCVar6);
  std::shared_ptr<Omega_h::Comm>::operator=(&this->world_,&local_248);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_248);
  pCVar6 = (Comm *)operator_new(0x50);
  Comm::Comm(pCVar6,this,false,false);
  std::shared_ptr<Omega_h::Comm>::shared_ptr<Omega_h::Comm,void>
            ((shared_ptr<Omega_h::Comm> *)&cmdline.parsed_help_,pCVar6);
  std::shared_ptr<Omega_h::Comm>::operator=
            (&this->self_,(shared_ptr<Omega_h::Comm> *)&cmdline.parsed_help_);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)&cmdline.parsed_help_);
  CmdLine::CmdLine((CmdLine *)local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"--osh-memory",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"print amount and stacktrace of max memory use",&local_2e1)
  ;
  CmdLine::add_flag((CmdLine *)local_298,(string *)local_2b8,(string *)local_2e0);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"--osh-time",&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_330,"print amount of time spend in certain functions",&local_331);
  CmdLine::add_flag((CmdLine *)local_298,(string *)local_308,(string *)local_330);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"--osh-time-percent",&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_380,"print amount of time spend in certain functions by percentage",
             (allocator *)((long)&osh_time_chop_flag + 7));
  CmdLine::add_flag((CmdLine *)local_298,(string *)local_358,(string *)local_380);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)((long)&osh_time_chop_flag + 7));
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"--osh-time-chop",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3d8,
             "only print functions whose percent time is greater than given value (e.g. --osh-time-chop=2)"
             ,&local_3d9);
  pCVar7 = CmdLine::add_flag((CmdLine *)local_298,(string *)local_3b0,(string *)local_3d8);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  local_390 = pCVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"0.0",&local_401);
  local_410 = 0.0;
  CmdLineFlag::add_arg<double>(pCVar7,(string *)local_400,&local_410);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"--osh-time-with-filename",&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_458,"add file name to function name in profile output",&local_459);
  CmdLine::add_flag((CmdLine *)local_298,(string *)local_430,(string *)local_458);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"--osh-signal",&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a8,"catch signals and print a stacktrace",&local_4a9);
  CmdLine::add_flag((CmdLine *)local_298,(string *)local_480,(string *)local_4a8);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"--osh-fpe",&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"enable floating-point exceptions",&local_4f9);
  CmdLine::add_flag((CmdLine *)local_298,(string *)local_4d0,(string *)local_4f8);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"--osh-silent",&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"suppress all output",&local_549);
  CmdLine::add_flag((CmdLine *)local_298,(string *)local_520,(string *)local_548);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"--osh-pool",&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_598,"use memory pooling",(allocator *)((long)&self_send_flag + 7));
  CmdLine::add_flag((CmdLine *)local_298,(string *)local_570,(string *)local_598);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)((long)&self_send_flag + 7));
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c8,"--osh-self-send",&local_5c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f0,"control self send threshold",&local_5f1);
  pCVar7 = CmdLine::add_flag((CmdLine *)local_298,(string *)local_5c8,(string *)local_5f0);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  local_5a8 = pCVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"value",(allocator *)((long)&mpi_ranks_flag + 7));
  mpi_ranks_flag._0_4_ = 0;
  CmdLineFlag::add_arg<int>(pCVar7,(string *)local_618,(int *)&mpi_ranks_flag);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mpi_ranks_flag + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_648,"--osh-mpi-ranks-per-node",&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_670,"mpi ranks per node (for CUDA+MPI)",&local_671);
  pCVar7 = CmdLine::add_flag((CmdLine *)local_298,(string *)local_648,(string *)local_670);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::~allocator((allocator<char> *)&local_649);
  local_628 = pCVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_698,"value",&local_699);
  local_6a0 = 0;
  CmdLineFlag::add_arg<int>(pCVar7,(string *)local_698,&local_6a0);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  if ((argc != (int *)0x0) && (argv != (char ***)0x0)) {
    std::shared_ptr<Omega_h::Comm>::shared_ptr((shared_ptr<Omega_h::Comm> *)local_6b0,&this->world_)
    ;
    bVar2 = CmdLine::parse((CmdLine *)local_298,(shared_ptr<Omega_h::Comm> *)local_6b0,argc,*argv);
    if (!bVar2) {
      fail("assertion %s failed at %s +%d\n","cmdline.parse(world_, argc, *argv)",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_library.cpp"
           ,0x77);
    }
    std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_6b0);
  }
  local_6b1 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"--osh-time-with-filename",(allocator *)((long)&chop + 7));
  bVar2 = CmdLine::parsed((CmdLine *)local_298,(string *)local_6d8);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&chop + 7));
  if (bVar2) {
    local_6b1 = 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_708,"--osh-time-chop",&local_709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_730,"0.0",&local_731);
  dVar9 = CmdLine::get<double>((CmdLine *)local_298,(string *)local_708,(string *)local_730);
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  local_6e8 = dVar9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_758,"--osh-time",&local_759);
  bVar2 = CmdLine::parsed((CmdLine *)local_298,(string *)local_758);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  if (bVar2) {
    pHVar8 = (History *)operator_new(0x70);
    local_771 = 1;
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_770,&this->world_);
    profile::History::History(pHVar8,&local_770,false,local_6e8,(bool)(local_6b1 & 1));
    local_771 = 0;
    profile::global_singleton_history = pHVar8;
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_770);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_798,"--osh-time-percent",&local_799);
  bVar2 = CmdLine::parsed((CmdLine *)local_298,(string *)local_798);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  if (bVar2) {
    pHVar8 = (History *)operator_new(0x70);
    local_7b1 = 1;
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_7b0,&this->world_);
    profile::History::History(pHVar8,&local_7b0,true,local_6e8,(bool)(local_6b1 & 1));
    local_7b1 = 0;
    profile::global_singleton_history = pHVar8;
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_7b0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7d8,"--osh-fpe",&local_7d9);
  bVar2 = CmdLine::parsed((CmdLine *)local_298,(string *)local_7d8);
  std::__cxx11::string::~string(local_7d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  if (bVar2) {
    enable_floating_point_exceptions();
  }
  this->self_send_threshold_ = 1000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_800,"--osh-self-send",&local_801);
  bVar2 = CmdLine::parsed((CmdLine *)local_298,(string *)local_800);
  std::__cxx11::string::~string(local_800);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_828,"--osh-self-send",&local_829);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_850,"value",&local_851);
    iVar3 = CmdLine::get<int>((CmdLine *)local_298,(string *)local_828,(string *)local_850);
    this->self_send_threshold_ = iVar3;
    std::__cxx11::string::~string(local_850);
    std::allocator<char>::~allocator((allocator<char> *)&local_851);
    std::__cxx11::string::~string(local_828);
    std::allocator<char>::~allocator((allocator<char> *)&local_829);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_878,"--osh-silent",&local_879);
  bVar2 = CmdLine::parsed((CmdLine *)local_298,(string *)local_878);
  this->silent_ = bVar2;
  std::__cxx11::string::~string(local_878);
  std::allocator<char>::~allocator((allocator<char> *)&local_879);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8a0,"--osh-signal",&local_8a1);
  bVar2 = CmdLine::parsed((CmdLine *)local_298,(string *)local_8a0);
  std::__cxx11::string::~string(local_8a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
  if (bVar2) {
    protect();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c8,"--osh-pool",&local_8c9);
  bVar2 = CmdLine::parsed((CmdLine *)local_298,(string *)local_8c8);
  std::__cxx11::string::~string(local_8c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
  if (bVar2) {
    enable_pooling();
  }
  CmdLine::~CmdLine((CmdLine *)local_298);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void Library::initialize(char const* head_desc, int* argc, char*** argv
#ifdef OMEGA_H_USE_MPI
    ,
    MPI_Comm comm_mpi
#endif
) {
  std::string lib_desc = OMEGA_H_SEMVER;
  if (lib_desc != head_desc) {
    std::stringstream msg;
    msg << "omega_h description string mismatch.\n";
    msg << "header says: " << head_desc << '\n';
    msg << "library says: " << lib_desc << '\n';
    std::string msg_str = msg.str();
    Omega_h::fail("%s\n", msg_str.c_str());
  }
  if (argc && argv) {
    for (int ic = 0; ic < *argc; ic++) {
      argv_.push_back((*argv)[ic]);
    }
  }
#ifdef OMEGA_H_USE_MPI
  int mpi_is_init;
  OMEGA_H_CHECK(MPI_SUCCESS == MPI_Initialized(&mpi_is_init));
  if (!mpi_is_init) {
    OMEGA_H_CHECK(MPI_SUCCESS == MPI_Init(argc, argv));
    we_called_mpi_init = true;
  } else {
    we_called_mpi_init = false;
  }
  MPI_Comm world_dup;
  MPI_Comm_dup(comm_mpi, &world_dup);
  world_ = CommPtr(new Comm(this, world_dup));

#ifdef OMEGA_H_DBG
  DBG_COMM = world_.get();
#endif

#else
  world_ = CommPtr(new Comm(this, false, false));
  self_ = CommPtr(new Comm(this, false, false));
#endif
  Omega_h::CmdLine cmdline;
  cmdline.add_flag(
      "--osh-memory", "print amount and stacktrace of max memory use");
  cmdline.add_flag(
      "--osh-time", "print amount of time spend in certain functions");
  cmdline.add_flag(
      "--osh-time-percent", "print amount of time spend in certain functions by percentage");
  auto& osh_time_chop_flag = cmdline.add_flag(
      "--osh-time-chop", "only print functions whose percent time is greater than given value (e.g. --osh-time-chop=2)");
  osh_time_chop_flag.add_arg<double>("0.0");
  cmdline.add_flag("--osh-time-with-filename", "add file name to function name in profile output");

  cmdline.add_flag("--osh-signal", "catch signals and print a stacktrace");
  cmdline.add_flag("--osh-fpe", "enable floating-point exceptions");
  cmdline.add_flag("--osh-silent", "suppress all output");
  cmdline.add_flag("--osh-pool", "use memory pooling");
  auto& self_send_flag =
      cmdline.add_flag("--osh-self-send", "control self send threshold");
  self_send_flag.add_arg<int>("value");
  auto& mpi_ranks_flag =
      cmdline.add_flag("--osh-mpi-ranks-per-node", "mpi ranks per node (for CUDA+MPI)");
  mpi_ranks_flag.add_arg<int>("value");
  if (argc && argv) {
    OMEGA_H_CHECK(cmdline.parse(world_, argc, *argv));
  }
  bool add_filename = false;
  if (cmdline.parsed("--osh-time-with-filename")) {
    add_filename = true;
  }
  double chop = cmdline.get<double>("--osh-time-chop", "0.0");
  if (cmdline.parsed("--osh-time")) {
    Omega_h::profile::global_singleton_history =
      new Omega_h::profile::History(world_, false, chop, add_filename);
  }
  if (cmdline.parsed("--osh-time-percent")) {
    Omega_h::profile::global_singleton_history =
      new Omega_h::profile::History(world_, true, chop, add_filename);
  }
  if (cmdline.parsed("--osh-fpe")) {
    enable_floating_point_exceptions();
  }
  self_send_threshold_ = 1000 * 1000;
  if (cmdline.parsed("--osh-self-send")) {
    self_send_threshold_ = cmdline.get<int>("--osh-self-send", "value");
  }
  silent_ = cmdline.parsed("--osh-silent");
#ifdef OMEGA_H_USE_KOKKOS
  if (!Kokkos::is_initialized()) {
    OMEGA_H_CHECK(argc != nullptr);
    OMEGA_H_CHECK(argv != nullptr);
    Kokkos::initialize(*argc, *argv);
    we_called_kokkos_init = true;
  } else {
    we_called_kokkos_init = false;
  }
#endif
#if defined(OMEGA_H_USE_CUDA) && defined(OMEGA_H_USE_MPI) \
  && (!defined(OMEGA_H_USE_KOKKOS))
  if (cmdline.parsed("--osh-mpi-ranks-per-node")) {
    int rank, ndevices_per_node, my_device;
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    cudaGetDeviceCount(&ndevices_per_node);
    int mpi_ranks_per_node =
      cmdline.get<int>("--osh-mpi-ranks-per-node", "value");
    int local_mpi_rank = rank % mpi_ranks_per_node;
    cudaSetDevice(local_mpi_rank);
    cudaGetDevice(&my_device);
    PCOUT("ndevices_per_node= " << ndevices_per_node << " mpi_ranks_per_node= " << mpi_ranks_per_node << " local_mpi_rank= " << local_mpi_rank << std::endl);
    OMEGA_H_CHECK_OP(mpi_ranks_per_node, ==, ndevices_per_node);
    OMEGA_H_CHECK_OP(my_device, ==, local_mpi_rank);
  }
#endif
  if (cmdline.parsed("--osh-signal")) Omega_h::protect();
#if defined(OMEGA_H_USE_CUDA) && (!defined(OMEGA_H_USE_KOKKOS))
  // trigger lazy initialization of the CUDA runtime
  // and prevent it from polluting later timings
  cudaFree(nullptr);
#endif
  if (cmdline.parsed("--osh-pool")) enable_pooling();
}